

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  int iVar1;
  SamplingMode *pSVar2;
  BoxCoordinatesMode *pBVar3;
  long lVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int index;
  
  iVar1 = (this->targetsize_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetsize_,index);
      lVar4 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      lVar10 = lVar10 + (ulong)((int)lVar4 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar9 = (uint)lVar10;
  if (lVar10 == 0) {
    uVar8 = 0;
  }
  else if ((int)uVar9 < 0) {
    uVar8 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar9 | 1) != 0) {
      for (; (uVar9 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar8 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_targetsize_cached_byte_size_ = uVar9;
  sVar7 = uVar8 + lVar10;
  pSVar2 = this->mode_;
  if (pSVar2 != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    uVar9 = pSVar2->samplingmethod_;
    if (uVar9 == 0) {
      uVar8 = 0;
    }
    else if ((int)uVar9 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    pSVar2->_cached_size_ = (int)uVar8;
    sVar7 = sVar7 + uVar8 + 2;
  }
  pBVar3 = this->boxindicesmode_;
  if (pBVar3 != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    uVar9 = pBVar3->boxmode_;
    if (uVar9 == 0) {
      uVar8 = 0;
    }
    else if ((int)uVar9 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    pBVar3->_cached_size_ = (int)uVar8;
    sVar7 = sVar7 + uVar8 + 2;
  }
  sVar6 = sVar7 + 2;
  if (this->normalizedcoordinates_ == false) {
    sVar6 = sVar7;
  }
  sVar7 = sVar6;
  if (this->spatialscale_ != 0.0) {
    sVar7 = sVar6 + 5;
  }
  if (NAN(this->spatialscale_)) {
    sVar7 = sVar6 + 5;
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->has_mode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->has_boxindicesmode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  if (this->spatialscale() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}